

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  ssl_connection_state sVar1;
  Curl_handler *pCVar2;
  char *pcVar3;
  char *__s2;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  hostname *phVar8;
  _Bool _Var9;
  int iVar10;
  curlntlm cVar11;
  uint uVar12;
  uint uVar13;
  connectbundle *pcVar14;
  timediff_t tVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  connectdata *conn;
  curl_llist_element *pcVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  curltime cVar23;
  curltime newer;
  curltime older;
  connectdata *local_80;
  
  iVar10 = IsMultiplexingPossible(data,needle);
  cVar23 = Curl_now();
  if (((data->state).authhost.want & 0x28) == 0) {
    bVar20 = false;
  }
  else {
    bVar20 = (needle->handler->protocol & 3) != 0;
  }
  if ((((needle->bits).field_0x5 & 1) == 0) || (((data->state).authproxy.want & 0x28) == 0)) {
    bVar21 = false;
  }
  else {
    bVar21 = (needle->handler->protocol & 3) != 0;
  }
  *force_reuse = false;
  *waitpipe = false;
  pcVar14 = Curl_conncache_find_bundle(needle,(data->state).conn_cache);
  if (pcVar14 != (connectbundle *)0x0) {
    phVar8 = &needle->conn_to_host;
    if (((needle->bits).field_0x4 & 4) == 0) {
      phVar8 = &needle->host;
    }
    bVar6 = false;
    Curl_infof(data,"Found bundle for host %s: %p [%s]\n",phVar8->name,pcVar14);
    if (iVar10 != 0) {
      iVar10 = pcVar14->multiuse;
      bVar6 = true;
      if (iVar10 == 0) {
        if (((data->set).field_0x87e & 1) != 0) {
          Curl_infof(data,"Server doesn\'t support multiplex yet, wait\n");
          *waitpipe = true;
          Curl_conncache_unlock(data);
          return false;
        }
        bVar6 = false;
        Curl_infof(data,"Server doesn\'t support multiplex (yet)\n");
        iVar10 = pcVar14->multiuse;
      }
      if ((iVar10 == 2) && (_Var9 = Curl_multiplex_wanted(data->multi), !_Var9)) {
        bVar6 = false;
        Curl_infof(data,"Could multiplex, but not asked to!\n");
      }
      if (pcVar14->multiuse == -1) {
        bVar6 = false;
        Curl_infof(data,"Can not multiplex, even if we wanted to!\n");
      }
    }
    pcVar19 = (pcVar14->conn_list).head;
    if (pcVar19 != (curl_llist_element *)0x0) {
      local_80 = (connectdata *)0x0;
      bVar16 = false;
      do {
        conn = (connectdata *)pcVar19->ptr;
        pcVar19 = pcVar19->next;
        if (*(int *)&(conn->bits).field_0x4 < 0) goto LAB_00487b22;
        if ((conn->data == (Curl_easy *)0x0) &&
           (uVar4 = (conn->lastused).tv_sec, uVar5 = (conn->lastused).tv_usec, older.tv_usec = uVar5
           , older.tv_sec = uVar4, newer._12_4_ = 0, newer.tv_sec = SUB128(cVar23._0_12_,0),
           newer.tv_usec = SUB124(cVar23._0_12_,8), older._12_4_ = 0,
           tVar15 = Curl_timediff(newer,older), (data->set).maxage_conn < tVar15 / 1000000)) {
          Curl_infof(data,"Too old connection (%ld seconds), disconnect it\n",tVar15 / 1000);
LAB_004877a1:
          Curl_disconnect(data,conn,true);
        }
        else {
          _Var9 = extract_if_dead(conn,data);
          if (_Var9) goto LAB_004877a1;
          if ((conn->easyq).size == 0) {
            if (bVar6) {
              bVar22 = false;
              goto LAB_004877e5;
            }
LAB_004877ff:
            uVar13 = *(uint *)&(conn->bits).field_0x4;
            if (conn->sock[0] == -1) {
              bVar16 = (bool)(bVar16 | (uVar13 & 1) == 0);
LAB_00487b08:
              Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                         conn->connection_id);
              goto LAB_00487b22;
            }
            if ((uVar13 & 1) != 0) goto LAB_00487b08;
            bVar7 = false;
            bVar22 = false;
          }
          else {
            bVar22 = pcVar14->multiuse == 2;
            if (!bVar6) {
              if (pcVar14->multiuse == 2) goto LAB_00487b22;
              goto LAB_004877ff;
            }
LAB_004877e5:
            uVar13 = *(uint *)&(conn->bits).field_0x4;
            bVar7 = true;
            if ((~uVar13 & 0x1001) == 0) goto LAB_00487b22;
          }
          pCVar2 = needle->handler;
          if ((((conn->handler->flags ^ pCVar2->flags) & 1) == 0) ||
             ((uVar12 = get_protocol_family(conn->handler->protocol), uVar12 == pCVar2->protocol &&
              ((conn->field_0x62c & 1) != 0)))) {
            uVar12 = *(uint *)&(needle->bits).field_0x4;
            uVar17 = uVar13 ^ uVar12;
            if (((uVar17 & 0x20) == 0) &&
               (uVar18 = uVar12 >> 6 & 1, uVar18 == ((uVar13 >> 6 & 1) != 0))) {
              if (uVar18 != 0) {
                _Var9 = proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy);
                if (!_Var9) goto LAB_00487b22;
                uVar12 = *(uint *)&(needle->bits).field_0x4;
                uVar17 = *(uint *)&(conn->bits).field_0x4 ^ uVar12;
              }
              if ((uVar17 & 0xc) == 0) {
                if ((uVar12 & 0x20) == 0) {
LAB_004878d3:
                  if (((bVar7) || (conn->data == (Curl_easy *)0x0)) &&
                     (((conn->easyq).size == 0 ||
                      ((conn->data == (Curl_easy *)0x0 || (conn->data->multi == needle->data->multi)
                       ))))) {
                    pcVar3 = needle->localdev;
                    if ((pcVar3 == (char *)0x0 && needle->localport == 0) ||
                       (((conn->localport == needle->localport &&
                         (conn->localportrange == needle->localportrange)) &&
                        ((pcVar3 == (char *)0x0 ||
                         ((conn->localdev != (char *)0x0 &&
                          (iVar10 = strcmp(conn->localdev,pcVar3), iVar10 == 0)))))))) {
                      pCVar2 = needle->handler;
                      uVar13 = pCVar2->flags;
                      if (((char)uVar13 < '\0') ||
                         ((iVar10 = strcmp(needle->user,conn->user), iVar10 == 0 &&
                          (iVar10 = strcmp(needle->passwd,conn->passwd), iVar10 == 0)))) {
                        uVar12 = *(uint *)&(needle->bits).field_0x4;
                        if (((uVar12 & 0x20) != 0) && ((uVar12 & 0x4000) == 0 && (uVar13 & 1) == 0))
                        goto LAB_00487a61;
                        iVar10 = Curl_strcasecompare(pCVar2->scheme,conn->handler->scheme);
                        if ((iVar10 != 0) ||
                           ((uVar13 = get_protocol_family(conn->handler->protocol),
                            uVar13 == needle->handler->protocol && ((conn->field_0x62c & 1) != 0))))
                        {
                          uVar13 = *(uint *)&(needle->bits).field_0x4;
                          if ((uVar13 & 4) != 0) {
                            iVar10 = Curl_strcasecompare((needle->conn_to_host).name,
                                                         (conn->conn_to_host).name);
                            if (iVar10 == 0) goto LAB_00487b22;
                            uVar13 = *(uint *)&(needle->bits).field_0x4;
                          }
                          if (((((uVar13 & 8) == 0) || (needle->conn_to_port == conn->conn_to_port))
                              && (iVar10 = Curl_strcasecompare((needle->host).name,(conn->host).name
                                                              ), iVar10 != 0)) &&
                             (needle->remote_port == conn->remote_port)) {
                            if ((needle->handler->flags & 1) == 0) {
LAB_00487a61:
                              if (bVar20) {
                                iVar10 = strcmp(needle->user,conn->user);
                                if (iVar10 != 0) goto LAB_00487b22;
                                cVar11 = strcmp(needle->passwd,conn->passwd);
                              }
                              else {
                                cVar11 = conn->http_ntlm_state;
                              }
                              if (cVar11 == NTLMSTATE_NONE) {
                                if (bVar21) {
                                  pcVar3 = (conn->http_proxy).user;
                                  if (((pcVar3 != (char *)0x0) &&
                                      (__s2 = (conn->http_proxy).passwd, __s2 != (char *)0x0)) &&
                                     ((iVar10 = strcmp((needle->http_proxy).user,pcVar3),
                                      iVar10 == 0 &&
                                      (iVar10 = strcmp((needle->http_proxy).passwd,__s2),
                                      iVar10 == 0)))) {
LAB_00487d4b:
                                    if (((bVar20) && (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
                                       ((local_80 = conn, bVar21 &&
                                        (conn->proxy_ntlm_state != NTLMSTATE_NONE)))) {
                                      *force_reuse = true;
                                      goto LAB_00487da7;
                                    }
                                  }
                                }
                                else if (conn->proxy_ntlm_state == NTLMSTATE_NONE) {
                                  if (bVar20) goto LAB_00487d4b;
                                  if ((bool)(bVar7 & bVar22)) {
                                    Curl_infof(data,"Multiplexed connection found!\n");
                                  }
                                  goto LAB_00487da7;
                                }
                              }
                            }
                            else {
                              _Var9 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config)
                              ;
                              if (_Var9) {
                                if (conn->ssl[0].state == ssl_connection_complete)
                                goto LAB_00487a61;
                                bVar16 = true;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  _Var9 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy);
                  if ((_Var9) &&
                     (((*(uint *)&(conn->bits).field_0x4 ^ *(uint *)&(needle->bits).field_0x4) >>
                       0xe & 1) == 0)) {
                    if ((needle->http_proxy).proxytype != CURLPROXY_HTTPS) goto LAB_004878d3;
                    if ((needle->handler->flags & 1) == 0) {
                      _Var9 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
                      if (_Var9) {
                        sVar1 = conn->ssl[0].state;
LAB_00487c38:
                        if (sVar1 == ssl_connection_complete) goto LAB_004878d3;
                      }
                    }
                    else {
                      _Var9 = Curl_ssl_config_matches
                                        (&needle->proxy_ssl_config,&conn->proxy_ssl_config);
                      if (_Var9) {
                        sVar1 = conn->proxy_ssl[0].state;
                        goto LAB_00487c38;
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00487b22:
      } while (pcVar19 != (curl_llist_element *)0x0);
      conn = local_80;
      if (local_80 == (connectdata *)0x0) {
        Curl_conncache_unlock(data);
        if (!bVar16) {
          return false;
        }
        if (((data->set).field_0x87e & 1) == 0) {
          return false;
        }
        Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
        *waitpipe = true;
        return false;
      }
LAB_00487da7:
      conn->data = data;
      Curl_conncache_unlock(data);
      *usethis = conn;
      return true;
    }
  }
  Curl_conncache_unlock(data);
  return false;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  bool canmultiplex = IsMultiplexingPossible(data, needle);
  struct connectbundle *bundle;
  struct curltime now = Curl_now();

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                      (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                      (needle->handler->protocol & PROTO_FAMILY_HTTP));
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                           ((data->state.authproxy.want &
                           (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                           (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* Look up the bundle with all the connections to this particular host.
     Locks the connection cache, beware of early returns! */
  bundle = Curl_conncache_find_bundle(needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p [%s]\n",
          (needle->bits.conn_to_host ? needle->conn_to_host.name :
           needle->host.name), (void *)bundle,
          (bundle->multiuse == BUNDLE_MULTIPLEX ?
           "can multiplex" : "serially"));

    /* We can't multiplex if we don't know anything about the server */
    if(canmultiplex) {
      if(bundle->multiuse == BUNDLE_UNKNOWN) {
        if((bundle->multiuse == BUNDLE_UNKNOWN) && data->set.pipewait) {
          infof(data, "Server doesn't support multiplex yet, wait\n");
          *waitpipe = TRUE;
          Curl_conncache_unlock(data);
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multiplex (yet)\n");
        canmultiplex = FALSE;
      }
      if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
         !Curl_multiplex_wanted(data->multi)) {
        infof(data, "Could multiplex, but not asked to!\n");
        canmultiplex = FALSE;
      }
      if(bundle->multiuse == BUNDLE_NO_MULTIUSE) {
        infof(data, "Can not multiplex, even if we wanted to!\n");
        canmultiplex = FALSE;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t multiplexed;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(check->bits.connect_only)
        /* connect-only connections will not be reused */
        continue;

      if(conn_maxage(data, check, now) || extract_if_dead(check, data)) {
        /* disconnect it */
        (void)Curl_disconnect(data, check, /* dead_connection */TRUE);
        continue;
      }

      multiplexed = CONN_INUSE(check) &&
        (bundle->multiuse == BUNDLE_MULTIPLEX);

      if(canmultiplex) {
        if(check->bits.protoconnstart && check->bits.close)
          continue;
      }
      else {
        if(multiplexed) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          if(!check->bits.close)
            foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->abstract_unix_socket != check->abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler->protocol) !=
           needle->handler->protocol || !check->tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy && !proxy_info_matches(&needle->socks_proxy,
                                                        &check->socks_proxy))
        continue;

      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
          else {
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config))
              continue;
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }
        }
      }

      if(!canmultiplex && check->data)
        /* this request can't be multiplexed but the checked connection is
           already in use so we skip it */
        continue;

      if(CONN_INUSE(check) && check->data &&
         (check->data->multi != needle->data->multi))
        /* this could be subject for multiplex use, but only if they belong to
         * the same multi handle */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(strcmp(needle->user, check->user) ||
           strcmp(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
      }

      if(!needle->bits.httpproxy || (needle->handler->flags&PROTOPT_SSL) ||
         needle->bits.tunnel_proxy) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler->protocol) ==
             needle->handler->protocol && check->tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(strcmp(needle->user, check->user) ||
             strcmp(needle->passwd, check->passwd))
            continue;
        }
        else if(check->http_ntlm_state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(strcmp(needle->http_proxy.user, check->http_proxy.user) ||
             strcmp(needle->http_proxy.passwd, check->http_proxy.passwd))
            continue;
        }
        else if(check->proxy_ntlm_state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }

        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->http_ntlm_state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxy_ntlm_state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canmultiplex) {
          /* We can multiplex if we want to. Let's continue looking for
             the optimal connection to use. */

          if(!multiplexed) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(multiplexed >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)\n",
                    multiplexed);
              continue;
            }
          }
#endif
          /* When not multiplexed, we have a match here! */
          chosen = check;
          infof(data, "Multiplexed connection found!\n");
          break;
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    /* mark it as used before releasing the lock */
    chosen->data = data; /* own it! */
    Curl_conncache_unlock(data);
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }
  Curl_conncache_unlock(data);

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set\n");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}